

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O3

uint Assimp::GetMeshVFormatUnique(aiMesh *pcMesh)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  long lVar6;
  
  if (pcMesh == (aiMesh *)0x0) {
    __assert_fail("__null != pcMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ProcessHelper.cpp"
                  ,0xb6,"unsigned int Assimp::GetMeshVFormatUnique(const aiMesh *)");
  }
  uVar1 = pcMesh->mNumVertices;
  uVar2 = (uint)(uVar1 != 0) * 2 | 1;
  if (pcMesh->mNormals == (aiVector3D *)0x0) {
    uVar2 = 1;
  }
  uVar4 = uVar2 + 4;
  if (uVar1 == 0) {
    uVar4 = 1;
  }
  if (pcMesh->mBitangents == (aiVector3D *)0x0) {
    uVar4 = uVar2;
  }
  if (pcMesh->mTangents == (aiVector3D *)0x0) {
    uVar4 = uVar2;
  }
  lVar6 = 0;
  do {
    if ((uVar1 == 0) || (pcMesh->mTextureCoords[lVar6] == (aiVector3D *)0x0)) break;
    iVar3 = 0x10000 << ((byte)lVar6 & 0x1f);
    if (pcMesh->mNumUVComponents[lVar6] != 3) {
      iVar3 = 0;
    }
    uVar4 = iVar3 + (0x100 << ((byte)lVar6 & 0x1f)) | uVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  lVar6 = 0;
  while( true ) {
    if (uVar1 == 0) {
      return uVar4;
    }
    if (pcMesh->mColors[lVar6] == (aiColor4D *)0x0) break;
    bVar5 = (byte)lVar6;
    lVar6 = lVar6 + 1;
    uVar4 = uVar4 | 0x1000000 << (bVar5 & 0x1f);
    if (lVar6 == 8) {
      return uVar4;
    }
  }
  return uVar4;
}

Assistant:

unsigned int GetMeshVFormatUnique(const aiMesh* pcMesh)
{
    ai_assert(NULL != pcMesh);

    // FIX: the hash may never be 0. Otherwise a comparison against
    // nullptr could be successful
    unsigned int iRet = 1;

    // normals
    if (pcMesh->HasNormals())iRet |= 0x2;
    // tangents and bitangents
    if (pcMesh->HasTangentsAndBitangents())iRet |= 0x4;

#ifdef BOOST_STATIC_ASSERT
    BOOST_STATIC_ASSERT(8 >= AI_MAX_NUMBER_OF_COLOR_SETS);
    BOOST_STATIC_ASSERT(8 >= AI_MAX_NUMBER_OF_TEXTURECOORDS);
#endif

    // texture coordinates
    unsigned int p = 0;
    while (pcMesh->HasTextureCoords(p))
    {
        iRet |= (0x100 << p);
        if (3 == pcMesh->mNumUVComponents[p])
            iRet |= (0x10000 << p);

        ++p;
    }
    // vertex colors
    p = 0;
    while (pcMesh->HasVertexColors(p))iRet |= (0x1000000 << p++);
    return iRet;
}